

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::ComputeSolutionHDivT<std::complex<double>>
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZMaterialDataT<std::complex<double>_> *data)

{
  TPZFNMatrix<110,_double> *A;
  TPZFNMatrix<20,_double> *this_00;
  long row;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  TPZManVector<std::complex<double>,_10> *pTVar5;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar6;
  TNode *pTVar7;
  complex<double> *pcVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  long *plVar14;
  TPZCompMesh *pTVar15;
  TPZFMatrix<std::complex<double>_> *this_01;
  ulong uVar16;
  complex<double> *pcVar17;
  double *pdVar18;
  Fad<double> *pFVar19;
  ulong uVar20;
  ulong uVar21;
  int j;
  ulong uVar22;
  int i;
  int iVar23;
  int s;
  long lVar24;
  ulong uVar25;
  int i_2;
  long lVar26;
  long col;
  bool bVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar28;
  long local_1318;
  long local_1310;
  undefined8 local_1308;
  long local_12f0;
  complex<double> meshsol;
  TPZFNMatrix<4,_double> Grad0;
  TPZFNMatrix<3,_double> Normalvec;
  TPZFMatrix<std::complex<double>_> GradOfPhiHdiv;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  
  plVar14 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  uVar12 = (**(code **)(*plVar14 + 0x78))(plVar14);
  uVar13 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar15 = TPZCompEl::Mesh((TPZCompEl *)this);
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar15->fSolution);
  if ((this_01->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol != 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x24e);
  }
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(&data->sol,1);
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize(&data->dsol,1);
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize(&data->divsol,1);
  local_1308 = 0.0;
  lVar24 = 0;
  lVar26 = 1;
  while (bVar27 = lVar26 != 0, lVar26 = lVar26 + -1, bVar27) {
    pTVar5 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
    (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                   (pTVar5->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                                  _vptr_TPZVec + lVar24) + 0x18))
              ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar5->fExtAlloc + -2))->
                      super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar24,
               (long)(int)(uVar12 * 3));
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore = (TPZFNMatrix<9,_double> *)0x0;
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)
               ((long)&(((TPZManVector<std::complex<double>,_10> *)
                        (((data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore)
                         ->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec +
               lVar24),(complex<double> *)&GradNormalvec,0,-1);
    pTVar6 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore;
    (**(code **)(*(long *)((long)(&((TPZFMatrix<std::complex<double>_> *)
                                   (&((TPZFMatrix<std::complex<double>_> *)
                                     (&(pTVar6->super_TPZFMatrix<std::complex<double>_>).fPivot + -1
                                     ))->fPivot + -1))->fPivot + 0xffffffffffffffff) +
                          (long)local_1308) + 0x70))
              ((long)(&((TPZFMatrix<std::complex<double>_> *)
                       (&((TPZFMatrix<std::complex<double>_> *)
                         (&(pTVar6->super_TPZFMatrix<std::complex<double>_>).fPivot + -1))->fPivot +
                       -1))->fPivot + 0xffffffffffffffff) + (long)local_1308,(long)(int)(uVar12 * 3)
               ,3);
    pTVar5 = (data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore;
    (**(code **)(*(long *)((long)&(((TPZManVector<std::complex<double>,_10> *)
                                   (pTVar5->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                                  _vptr_TPZVec + lVar24) + 0x18))
              ((long)&(((TPZManVector<std::complex<double>,_10> *)(pTVar5->fExtAlloc + -2))->
                      super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar24,(long)(int)uVar12);
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore = (TPZFNMatrix<9,_double> *)0x0;
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)
               ((long)&(((TPZManVector<std::complex<double>,_10> *)
                        (((data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.
                         fStore)->fExtAlloc + -2))->super_TPZVec<std::complex<double>_>).
                       _vptr_TPZVec + lVar24),(complex<double> *)&GradNormalvec,0,-1);
    lVar24 = lVar24 + 0xc0;
    local_1308 = (double)((long)local_1308 + 0x280);
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&GradOfPhiHdiv,3,3);
  memset(GradOfPhiHdiv.fElem,0,
         GradOfPhiHdiv.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         GradOfPhiHdiv.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  GradOfPhiHdiv.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  lVar26 = (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (&Normalvec,
             (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                        super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,lVar26,
             (double *)&GradNormalvec);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector(&GradNormalvec,lVar26);
  A = &(data->super_TPZMaterialData).fDeformedDirections;
  lVar24 = 0;
  for (lVar26 = 0; lVar26 < GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements;
      lVar26 = lVar26 + 1) {
    (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                   (&((TPZFMatrix<double> *)
                                     (&((GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)
                                       ->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->
                                   fPivot + 0xffffffffffffffff) + lVar24) + 0x70))
              ((long)(&((TPZFMatrix<double> *)
                       (&((TPZFMatrix<double> *)
                         (&((GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)->
                           super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->fPivot +
                     0xffffffffffffffff) + lVar24,3,3);
    lVar24 = lVar24 + 0xe0;
  }
  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == false) {
    TPZFMatrix<double>::operator=(&Normalvec.super_TPZFMatrix<double>,&A->super_TPZFMatrix<double>);
    pTVar15 = TPZCompEl::Mesh((TPZCompEl *)this);
    this_00 = &(data->super_TPZMaterialData).phi;
    uVar16 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar16 = 0;
    }
    uVar22 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar22 = 0;
    }
    local_1310 = 0;
    local_1318 = 0;
    local_12f0 = 0;
    for (iVar23 = 0; iVar23 != (int)uVar22; iVar23 = iVar23 + 1) {
      lVar26 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar23);
      pTVar7 = (pTVar15->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      iVar4 = pTVar7[*(int *)(lVar26 + 8)].pos;
      uVar20 = (long)pTVar7[*(int *)(lVar26 + 8)].dim / (long)(int)uVar12;
      local_1310 = (long)(int)local_1310;
      local_1318 = (long)(int)local_1318;
      local_12f0 = (long)(int)local_12f0;
      uVar21 = uVar20 & 0xffffffff;
      if ((int)uVar20 < 1) {
        uVar21 = 0;
      }
      for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
        for (lVar26 = 0; lVar26 != 1; lVar26 = lVar26 + 1) {
          for (uVar25 = 0; uVar25 != uVar16; uVar25 = uVar25 + 1) {
            pcVar17 = TPZFMatrix<std::complex<double>_>::operator()
                                (this_01,uVar20 * (long)(int)uVar12 + (long)iVar4 + uVar25,lVar26);
            meshsol._M_value._0_8_ = *(undefined8 *)pcVar17->_M_value;
            meshsol._M_value._8_8_ = *(undefined8 *)(pcVar17->_M_value + 8);
            pdVar18 = TPZFMatrix<double>::operator()
                                (&this_00->super_TPZFMatrix<double>,local_1310,0);
            dVar1 = *pdVar18;
            TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&Grad0,3);
            for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
              if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                pFVar19 = TPZFMatrix<Fad<double>_>::operator()
                                    (&(data->super_TPZMaterialData).fDeformedDirectionsFad,lVar24,
                                     local_1318);
              }
              else {
                pFVar19 = (Fad<double> *)
                          TPZFMatrix<double>::operator()
                                    (&A->super_TPZFMatrix<double>,lVar24,local_1318);
              }
              *(double *)
               (Grad0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
               lVar24 * 8) = pFVar19->val_;
            }
            pdVar18 = TPZFMatrix<double>::operator()
                                (&(data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>,
                                 local_12f0,0);
            pcVar8 = (data->divsol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore
                     [lVar26].super_TPZVec<std::complex<double>_>.fStore;
            dVar2 = *pdVar18;
            pcVar17 = pcVar8 + uVar25;
            dVar3 = *(double *)(pcVar17->_M_value + 8);
            pcVar8 = pcVar8 + uVar25;
            *(double *)pcVar8->_M_value =
                 *(double *)pcVar17->_M_value + dVar2 * (double)meshsol._M_value._0_8_;
            *(double *)(pcVar8->_M_value + 8) = dVar3 + dVar2 * (double)meshsol._M_value._8_8_;
            for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
              dVar2 = *(double *)
                       (Grad0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                        fRow + lVar24 * 8) * dVar1;
              row = lVar24 + uVar25 * 3;
              pcVar8 = (data->sol).super_TPZVec<TPZManVector<std::complex<double>,_10>_>.fStore
                       [lVar26].super_TPZVec<std::complex<double>_>.fStore;
              pcVar17 = pcVar8 + row;
              dVar3 = *(double *)(pcVar17->_M_value + 8);
              dVar28 = *(double *)pcVar17->_M_value + dVar2 * (double)meshsol._M_value._0_8_;
              pcVar8 = pcVar8 + row;
              *(double *)pcVar8->_M_value = dVar28;
              *(double *)(pcVar8->_M_value + 8) = dVar3 + dVar2 * (double)meshsol._M_value._8_8_;
              for (col = 0; col != 3; col = col + 1) {
                pcVar17 = TPZFMatrix<std::complex<double>_>::operator()(&GradOfPhiHdiv,lVar24,col);
                std::operator*(&meshsol,pcVar17);
                local_1308 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                pcVar17 = TPZFMatrix<std::complex<double>_>::operator()
                                    (&(data->dsol).
                                      super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore
                                      [lVar26].super_TPZFMatrix<std::complex<double>_>,row,col);
                dVar2 = *(double *)(pcVar17->_M_value + 8);
                local_1308 = local_1308 + *(double *)pcVar17->_M_value;
                *(double *)pcVar17->_M_value = local_1308;
                *(double *)(pcVar17->_M_value + 8) = dVar28 + dVar2;
                if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                  pdVar18 = TPZFMatrix<double>::operator()
                                      (&GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore
                                        [local_1318].super_TPZFMatrix<double>,lVar24,col);
                  uVar11 = meshsol._M_value._8_8_;
                  uVar10 = meshsol._M_value._0_8_;
                  dVar2 = *pdVar18;
                  pdVar18 = TPZFMatrix<double>::operator()
                                      (&this_00->super_TPZFMatrix<double>,local_1310,0);
                  dVar3 = *pdVar18;
                  pcVar17 = TPZFMatrix<std::complex<double>_>::operator()
                                      (&(data->dsol).
                                        super_TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>.fStore
                                        [lVar26].super_TPZFMatrix<std::complex<double>_>,row,col);
                  local_1308 = dVar3 * (double)uVar10 * dVar2;
                  dVar2 = *(double *)(pcVar17->_M_value + 8) + dVar3 * (double)uVar11 * dVar2;
                  auVar9._8_4_ = SUB84(dVar2,0);
                  auVar9._0_8_ = *(double *)pcVar17->_M_value + local_1308;
                  auVar9._12_4_ = (int)((ulong)dVar2 >> 0x20);
                  *(undefined1 (*) [16])pcVar17->_M_value = auVar9;
                }
                dVar28 = local_1308;
              }
            }
            TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&Grad0);
          }
        }
        local_12f0 = local_12f0 + 1;
        local_1318 = local_1318 + 1;
        local_1310 = local_1310 + 1;
      }
    }
    TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(&GradNormalvec);
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&Normalvec);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&GradOfPhiHdiv);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp",
             0x26c);
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}